

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode ftp_epsv_disable(Curl_easy *data,connectdata *conn)

{
  CURLcode result;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  if (((((ulong)conn->bits >> 0xb & 1) == 0) || (((ulong)conn->bits >> 3 & 1) != 0)) ||
     (((ulong)conn->bits >> 1 & 1) != 0)) {
    if (((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x894 >> 0x1e & 1) != 0)) &&
       (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))) {
      Curl_infof(data,"Failed EPSV attempt. Disabling EPSV");
    }
    conn->bits = (ConnectBits)((ulong)conn->bits & 0xffffffffffff7fff);
    Curl_conn_close(data,1);
    Curl_conn_cf_discard_all(data,conn,1);
    *(uint *)&(data->state).field_0x7be = *(uint *)&(data->state).field_0x7be & 0xffffffdf;
    data_local._4_4_ = Curl_pp_sendf(data,&(conn->proto).ftpc.pp,"%s","PASV");
    if (data_local._4_4_ == CURLE_OK) {
      (conn->proto).ftpc.count1 = (conn->proto).ftpc.count1 + 1;
      _ftp_state(data,'\x1e');
    }
  }
  else {
    Curl_failf(data,"Failed EPSV attempt, exiting");
    data_local._4_4_ = CURLE_WEIRD_SERVER_REPLY;
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode ftp_epsv_disable(struct Curl_easy *data,
                                 struct connectdata *conn)
{
  CURLcode result = CURLE_OK;

  if(conn->bits.ipv6
#ifndef CURL_DISABLE_PROXY
     && !(conn->bits.tunnel_proxy || conn->bits.socksproxy)
#endif
    ) {
    /* We cannot disable EPSV when doing IPv6, so this is instead a fail */
    failf(data, "Failed EPSV attempt, exiting");
    return CURLE_WEIRD_SERVER_REPLY;
  }

  infof(data, "Failed EPSV attempt. Disabling EPSV");
  /* disable it for next transfer */
  conn->bits.ftp_use_epsv = FALSE;
  Curl_conn_close(data, SECONDARYSOCKET);
  Curl_conn_cf_discard_all(data, conn, SECONDARYSOCKET);
  data->state.errorbuf = FALSE; /* allow error message to get
                                         rewritten */
  result = Curl_pp_sendf(data, &conn->proto.ftpc.pp, "%s", "PASV");
  if(!result) {
    conn->proto.ftpc.count1++;
    /* remain in/go to the FTP_PASV state */
    ftp_state(data, FTP_PASV);
  }
  return result;
}